

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::
ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
::reserve(ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *this,size_t minSize)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  if (this->numAllocated < minSize) {
    uVar2 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar2 != 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new__(uVar2 << 5);
      lVar3 = 0;
      for (uVar4 = 0; uVar4 < this->numActive; uVar4 = uVar4 + 1) {
        std::__cxx11::string::string
                  ((string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3),
                   (string *)((long)&(this->items->_M_dataplus)._M_p + lVar3));
        std::__cxx11::string::~string((string *)((long)&(this->items->_M_dataplus)._M_p + lVar3));
        lVar3 = lVar3 + 0x20;
      }
      freeIfHeapAllocated(this);
      this->items = pbVar1;
    }
    this->numAllocated = uVar2;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }